

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O2

int fits_clean_url(char *inURL,char *outURL,int *status)

{
  uint uVar1;
  grp_stack *mystack_00;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  grp_stack_data __s;
  size_t sVar5;
  size_t sVar6;
  grp_stack *mystack;
  
  uVar1 = *status;
  mystack = (grp_stack *)(ulong)uVar1;
  if (uVar1 != 0) {
    return uVar1;
  }
  mystack_00 = (grp_stack *)calloc(1,0x10);
  *outURL = '\0';
  mystack = mystack_00;
  pcVar2 = strstr(inURL,"://");
  pcVar3 = inURL;
  if (pcVar2 != (char *)0x0) {
    pcVar3 = strchr(pcVar2 + 3,0x2f);
    if (pcVar3 == (char *)0x0) {
      strcpy(outURL,inURL);
      goto LAB_001b1a49;
    }
    strncpy(outURL,inURL,(long)pcVar3 - (long)inURL);
    outURL[(long)pcVar3 - (long)inURL] = '\0';
  }
  pcVar2 = pcVar3;
  if (*pcVar3 == '/') {
    sVar4 = strlen(outURL);
    (outURL + sVar4)[0] = '/';
    (outURL + sVar4)[1] = '\0';
  }
  while (pcVar2 = strtok(pcVar2,"/"), pcVar2 != (char *)0x0) {
    if (*pcVar2 == '.') {
      if ((pcVar2[1] == '.') && (pcVar2[2] == '\0')) {
        if (mystack_00->stack_size == 0) {
          if (*pcVar3 != '/') goto LAB_001b1986;
        }
        else {
          pop_grp_stack(mystack_00);
        }
      }
      else if (pcVar2[1] != '\0') goto LAB_001b1986;
    }
    else {
LAB_001b1986:
      push_grp_stack(mystack_00,pcVar2);
    }
    pcVar2 = (char *)0x0;
  }
  sVar6 = mystack_00->stack_size;
  while (sVar6 != 0) {
    __s = grp_stack_remove(mystack_00->top->next);
    sVar6 = mystack_00->stack_size - 1;
    mystack_00->stack_size = sVar6;
    if (sVar6 == 0) {
      mystack_00->top = (grp_stack_item *)0x0;
    }
    sVar4 = strlen(outURL);
    sVar5 = strlen(__s);
    if ((sVar5 + sVar4) - 0x400 < 0xfffffffffffffbff) {
      *outURL = '\0';
      ffpmsg("outURL is too long (fits_clean_url)");
      *status = 0x7d;
      goto LAB_001b1a49;
    }
    strcat(outURL,__s);
    sVar4 = strlen(outURL);
    (outURL + sVar4)[0] = '/';
    (outURL + sVar4)[1] = '\0';
  }
  sVar4 = strlen(outURL);
  outURL[sVar4 - 1] = '\0';
LAB_001b1a49:
  delete_grp_stack(&mystack);
  return *status;
}

Assistant:

int fits_clean_url(char *inURL,  /* I input URL string                      */
		   char *outURL, /* O output URL string                     */
		   int  *status)
/*
  clean the URL by eliminating any ".." or "." specifiers in the inURL
  string, and write the output to the outURL string.

  Note that this function must have a valid Unix-style URL as input; platform
  dependent path strings are not allowed.
 */
{
  grp_stack* mystack; /* stack to hold pieces of URL */
  char* tmp;
  char *saveptr;

  if(*status) return *status;

  mystack = new_grp_stack();
  *outURL = 0;

  do {
    /* handle URL scheme and domain if they exist */
    tmp = strstr(inURL, "://");
    if(tmp) {
      /* there is a URL scheme, so look for the end of the domain too */
      tmp = strchr(tmp + 3, '/');
      if(tmp) {
        /* tmp is now the end of the domain, so
         * copy URL scheme and domain as is, and terminate by hand */
        size_t string_size = (size_t) (tmp - inURL);
        strncpy(outURL, inURL, string_size);
        outURL[string_size] = 0;

        /* now advance the input pointer to just after the domain and go on */
        inURL = tmp;
      } else {
        /* '/' was not found, which means there are no path-like
         * portions, so copy whole inURL to outURL and we're done */
        strcpy(outURL, inURL);
        continue; /* while(0) */
      }
    }

    /* explicitly copy a leading / (absolute path) */
    if('/' == *inURL) strcat(outURL, "/");

    /* now clean the remainder of the inURL. push URL segments onto
     * stack, dealing with .. and . as we go */
    tmp = ffstrtok(inURL, "/",&saveptr); /* finds first / */
    while(tmp) {
      if(!strcmp(tmp, "..")) {
        /* discard previous URL segment, if there was one. if not,
         * add the .. to the stack if this is *not* an absolute path
         * (for absolute paths, leading .. has no effect, so skip it) */
        if(0 < mystack->stack_size) pop_grp_stack(mystack);
        else if('/' != *inURL) push_grp_stack(mystack, tmp);
      } else {
        /* always just skip ., but otherwise add segment to stack */
        if(strcmp(tmp, ".")) push_grp_stack(mystack, tmp);
      }
      tmp = ffstrtok(NULL, "/",&saveptr); /* get the next segment */
    }

    /* stack now has pieces of cleaned URL, so just catenate them
     * onto output string until stack is empty */
    while(0 < mystack->stack_size) {
      tmp = shift_grp_stack(mystack);
      if (strlen(outURL) + strlen(tmp) + 1 > FLEN_FILENAME-1)
      {
         outURL[0]=0;
         ffpmsg("outURL is too long (fits_clean_url)");
         *status = URL_PARSE_ERROR;
         delete_grp_stack(&mystack);
         return *status;         
      }
      strcat(outURL, tmp);
      strcat(outURL, "/");
    }
    outURL[strlen(outURL) - 1] = 0; /* blank out trailing / */
  } while(0);
  delete_grp_stack(&mystack);
  return *status;
}